

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void door_handling(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  doorindex_t dVar4;
  door_t *pdVar5;
  
  if (state->room_index != '\0') {
    door_handling_interior(state,vischar);
    return;
  }
  bVar1 = vischar->direction;
  pdVar5 = doors;
  if (1 < bVar1) {
    pdVar5 = doors + 1;
  }
  dVar4 = '\0';
  while ((bVar2 = pdVar5->room_and_direction, (bVar2 & 3) != bVar1 ||
         (iVar3 = door_in_range(state,pdVar5), iVar3 != 0))) {
    pdVar5 = pdVar5 + 2;
    dVar4 = dVar4 + '\x01';
    if (dVar4 == '\x10') {
      return;
    }
  }
  state->current_door = dVar4;
  iVar3 = is_door_locked(state);
  if (iVar3 != 0) {
    return;
  }
  vischar->room = bVar2 >> 2;
  if ((bVar2 & 2) == 0) {
    pdVar5 = pdVar5 + 1;
  }
  else {
    pdVar5 = pdVar5 + -1;
  }
  transition(state,&pdVar5->mappos);
  return;
}

Assistant:

void door_handling(tgestate_t *state, vischar_t *vischar)
{
  const door_t *door_pos;  /* was HL */
  direction_t   direction; /* was E */
  uint8_t       iters;     /* was B */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Interior doors are handled by another routine. */
  if (state->room_index > room_0_OUTDOORS)
  {
    door_handling_interior(state, vischar); /* was tail call */
    return;
  }

  /* Select a start position in doors[] based on the direction the hero is
   * facing. */
  door_pos = &doors[0];
  direction = vischar->direction;
  if (direction >= direction_BOTTOM_RIGHT) /* BOTTOM_RIGHT or BOTTOM_LEFT */
    door_pos = &doors[1];

  /* The first 16 (pairs of) entries in doors[] are the only ones with
   * room_0_OUTDOORS as a destination, so only consider those. */
  iters = 16;
  do
  {
    if ((door_pos->room_and_direction & door_FLAGS_MASK_DIRECTION) == direction)
      if (door_in_range(state, door_pos) == 0)
        goto found;
    door_pos += 2;
  }
  while (--iters);

  /* Conv: Removed unused 'A &= B' op. */

  return;

found:
  state->current_door = 16 - iters;

  if (is_door_locked(state))
    return;

  vischar->room = (door_pos->room_and_direction & ~door_FLAGS_MASK_DIRECTION) >> 2; // sampled HL = $792E (in doors[])
  ASSERT_ROOM_VALID(vischar->room);
  if ((door_pos->room_and_direction & door_FLAGS_MASK_DIRECTION) < direction_BOTTOM_RIGHT) /* TL or TR */
    /* Point to the next door's pos */
    transition(state, &door_pos[1].mappos);
  else
    /* Point to the previous door's pos */
    transition(state, &door_pos[-1].mappos);

  NEVER_RETURNS; // highly likely if this is only tiggered by the hero
}